

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O1

LispPTR CHAR_closefile(LispPTR *args)

{
  int iVar1;
  LispPTR LVar2;
  int *piVar3;
  uint uVar4;
  
  uVar4 = args[1];
  if ((uVar4 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
  }
  Lisp_errno = (int *)(Lisp_world + uVar4);
  uVar4 = *args;
  if ((uVar4 & 0xfff0000) == 0xf0000) {
    uVar4 = uVar4 | 0xffff0000;
  }
  else if ((uVar4 & 0xfff0000) == 0xe0000) {
    uVar4 = uVar4 & 0xffff;
  }
  else {
    if ((uVar4 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
    }
    uVar4 = *(uint *)(Lisp_world + uVar4);
  }
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    alarm(TIMEOUT_TIME);
    piVar3 = __errno_location();
    do {
      *piVar3 = 0;
      iVar1 = close(uVar4);
      if (iVar1 != -1) {
        alarm(0);
        return 0x4c;
      }
    } while (*piVar3 == 4);
    alarm(0);
    LVar2 = 0x4c;
    if (*piVar3 != 1) {
      err_mess("close",*piVar3);
      *Lisp_errno = *piVar3;
      LVar2 = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    LVar2 = 0;
  }
  return LVar2;
}

Assistant:

LispPTR CHAR_closefile(LispPTR *args)
/* args[0]            fd      */
/* args[1]            errno   */
{
#ifndef DOS
  int fd; /* file descriptor */
  int rval;
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[1]);
  fd = LispNumToCInt(args[0]);
  ERRSETJMP(NIL);
  TIMEOUT(rval = close(fd));
  if (rval == -1) {
    /** This if is a patch for an apparent problem **/
    /** in SunOS 4 that causes a close on /dev/ttya **/
    /** to error with 'not owner' **/
    if (errno == 1) {
      DBPRINT(("Got errno 1 on a CLOSE!"));
      return (ATOM_T);
    }
    DBPRINT(("Closing char device descriptor #%d.\n", fd));
    err_mess("close", errno);
    *Lisp_errno = errno;
    return (NIL);
  }
  return (ATOM_T);
#endif /* DOS */
}